

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O1

void __thiscall CSR::initializeWithMatirx1(CSR *this,Matrix *m)

{
  double dVar1;
  double *pdVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  double *pdVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong __n;
  int iVar13;
  
  this->row = m->rowNo;
  this->col = m->colNo;
  iVar4 = Matrix::getNonzero(m);
  this->nonzero = iVar4;
  lVar9 = (long)this->row;
  uVar12 = lVar9 * 4 + 4;
  if (lVar9 < -1) {
    uVar12 = 0xffffffffffffffff;
  }
  piVar5 = (int *)operator_new__(uVar12);
  iVar13 = 0;
  memset(piVar5,0,uVar12);
  this->ptr = piVar5;
  uVar12 = (long)iVar4 * 4;
  if (iVar4 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  __n = (long)iVar4 * 8;
  if (iVar4 < 0) {
    __n = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar12);
  memset(piVar6,0,uVar12);
  this->idx = piVar6;
  pdVar7 = (double *)operator_new__(__n);
  memset(pdVar7,0,__n);
  uVar12 = lVar9 * 4;
  this->val = pdVar7;
  if (lVar9 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar12);
  this->nzRow = piVar6;
  *piVar5 = 0;
  lVar9 = std::chrono::_V2::system_clock::now();
  if (0 < this->row) {
    piVar5 = this->ptr;
    piVar6 = this->nzRow;
    lVar10 = 0;
    do {
      if (this->col < 1) {
        iVar4 = 0;
      }
      else {
        pdVar7 = m->array[lVar10];
        pdVar2 = this->val;
        piVar3 = this->idx;
        lVar11 = 0;
        iVar4 = 0;
        do {
          dVar1 = pdVar7[lVar11];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            pdVar2[iVar13] = dVar1;
            piVar3[iVar13] = (int)lVar11;
            iVar13 = iVar13 + 1;
            iVar4 = iVar4 + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < this->col);
      }
      piVar6[lVar10] = iVar4;
      piVar5[lVar10 + 1] = iVar4 + piVar5[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->row);
  }
  lVar10 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"execution time (initialize CSR):",0x20);
  poVar8 = std::ostream::_M_insert<double>((double)(lVar10 - lVar9) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if (this->nzRow == (int *)0x0) {
    return;
  }
  operator_delete__(this->nzRow);
  return;
}

Assistant:

void CSR::initializeWithMatirx1(Matrix *m)//Private
{
    int c = 0;
    int s;
    row = m->rowNo;
    col = m->colNo;
    nonzero = m->getNonzero();

    ptr = new int[row + 1]();
    idx = new int[nonzero]();
    val = new double[nonzero]();
    nzRow = new int[row];
    ptr[0] = 0;

    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    start = std::chrono::system_clock::now();
    for (int i = 0; i < row; i++)
    {
        s = 0;
        for (int j = 0; j < col; j++)
        {
            if (m->array[i][j] != 0)
            {
                val[c] = m->array[i][j];
                idx[c] = j;
                c++;
                s++;
            }
        }
        nzRow[i] = s;
        ptr[i+1] = ptr[i]+nzRow[i];
    }

    end = std::chrono::system_clock::now();
    elapsed_seconds = end - start;
    double durationSym = elapsed_seconds.count();
    cout << "execution time (initialize CSR):" << durationSym << "\n";

    delete []nzRow;
}